

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string.cpp
# Opt level: O2

void coda_get_stringset(char *str,
                       set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *result)

{
  char *pcVar1;
  allocator local_51;
  string temp;
  
  if ((str != (char *)0x0) && (*str != '\0')) {
    while (str != (char *)0x0) {
      pcVar1 = strchr(str,0x2c);
      if (pcVar1 == (char *)0x0) {
        std::__cxx11::string::string((string *)&temp,str,&local_51);
        std::
        _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
        ::_M_insert_unique<std::__cxx11::string_const&>
                  ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                    *)result,&temp);
        std::__cxx11::string::~string((string *)&temp);
        str = (char *)0x0;
      }
      else {
        temp._M_dataplus._M_p = (pointer)&temp.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&temp,str,pcVar1);
        std::
        _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
        ::_M_insert_unique<std::__cxx11::string_const&>
                  ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                    *)result,&temp);
        str = pcVar1 + 1;
        std::__cxx11::string::~string((string *)&temp);
      }
    }
  }
  return;
}

Assistant:

void coda_get_stringset(const char* str, std::set<std::string>& result)
{
	if (!str || !*str)
	{
		return;
	}

	const char* begin = str;
	const char* i = str;
	while (i)
	{
		i = strchr(i, ',');
		if (i)
		{
			std::string temp(begin, i - begin);
			result.insert(temp);
			++i;
		}
		else
		{
			std::string temp(begin);
			result.insert(temp);
		}
		begin = i;
	}
}